

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::Matches
          (TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = MatcherBase<pstore::gsl::span<int,_-1L>_>::Matches
                    ((MatcherBase<pstore::gsl::span<int,__1L>_> *)&this->matchers_,
                     (span<int,__1L> *)args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<pstore::gsl::span<int,_-1L>_>_&>::Matches
                      (&(this->extra_matcher_).
                        super_MatcherBase<const_std::tuple<pstore::gsl::span<int,__1L>_>_&>,args);
    return bVar1;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }